

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb_debug.h
# Opt level: O1

bool immutable::rrb_details::validate_subtree<char,false,5>
               (ref<immutable::rrb_details::tree_node<char,_false>_> *root,uint32_t expected_size,
               uint32_t root_shift)

{
  uint32_t uVar1;
  internal_node<char,_false> *p_node;
  rrb_size_table<false> *prVar2;
  uint32_t *puVar3;
  bool bVar4;
  bool bVar5;
  uint32_t uVar6;
  uint uVar7;
  byte bVar8;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  ref<immutable::rrb_details::tree_node<char,_false>_> child;
  ref<immutable::rrb_details::tree_node<char,_false>_> local_48;
  uint32_t local_3c;
  uint32_t local_38;
  uint32_t local_34;
  
  uVar11 = (ulong)expected_size;
  p_node = (internal_node<char,_false> *)root->ptr;
  if (root_shift == 0) {
    if (p_node == (internal_node<char,_false> *)0x0) goto LAB_001490f6;
    if (p_node->type != LEAF_NODE) {
      puts("Expected this node to be a leaf node, but it claims to be something else.");
      pcVar10 = "Will treat it like a leaf node, so may segfault.";
      goto LAB_00148f6c;
    }
    p_node->_ref_count = p_node->_ref_count + 1;
    uVar7 = p_node->len;
    if (uVar7 != expected_size) {
      uVar9 = uVar11;
      if (expected_size < uVar7) {
        uVar9 = (ulong)uVar7;
      }
      printf("Leaf node claims to be %u elements long, but was expected to be %u\n elements long. Will attempt to read %u elements.\n"
             ,(ulong)uVar7,uVar11,uVar9);
    }
    uVar6 = p_node->_ref_count;
    p_node->_ref_count = uVar6 - 1;
    if (uVar6 == 1) {
      free(p_node);
    }
    if (uVar7 != expected_size) goto LAB_00148fb7;
LAB_001490e5:
    bVar4 = true;
  }
  else {
    if (p_node == (internal_node<char,_false> *)0x0) {
LAB_001490f6:
      pcVar10 = 
      "T *immutable::ref<immutable::rrb_details::tree_node<char, false>>::operator->() const [T = immutable::rrb_details::tree_node<char, false>]"
      ;
LAB_00149122:
      __assert_fail("ptr != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                    ,0x71a,pcVar10);
    }
    if (p_node->type == INTERNAL_NODE) {
      p_node->_ref_count = p_node->_ref_count + 1;
      prVar2 = (p_node->size_table).ptr;
      if (prVar2 == (rrb_size_table<false> *)0x0) {
        bVar8 = (byte)root_shift;
        local_34 = 1 << (bVar8 & 0x1f);
        uVar6 = p_node->len << (bVar8 & 0x1f);
        if (uVar6 < expected_size) {
          pcVar10 = 
          "Expected size (%u) is larger than what can possibly be inside this subtree: %u.\n";
        }
        else {
          uVar6 = p_node->len - 1 << (bVar8 & 0x1f);
          if (uVar6 <= expected_size) {
            local_3c = root_shift - 5;
            bVar4 = p_node->len != 1;
            local_38 = expected_size;
            if (bVar4) {
              uVar11 = 0;
              do {
                local_48.ptr = (tree_node<char,_false> *)p_node->child[uVar11].ptr;
                if ((internal_node<char,_false> *)local_48.ptr != (internal_node<char,_false> *)0x0)
                {
                  ((internal_node<char,_false> *)local_48.ptr)->_ref_count =
                       ((internal_node<char,_false> *)local_48.ptr)->_ref_count + 1;
                }
                bVar5 = validate_subtree<char,false,5>(&local_48,local_34,local_3c);
                ref<immutable::rrb_details::tree_node<char,_false>_>::~ref(&local_48);
                if (!bVar5) {
                  if (bVar4) goto LAB_001490d1;
                  break;
                }
                uVar11 = uVar11 + 1;
                bVar4 = uVar11 < p_node->len - 1;
              } while (bVar4);
            }
            uVar7 = p_node->len - 1;
            local_48.ptr = (tree_node<char,_false> *)p_node->child[uVar7].ptr;
            if ((internal_node<char,_false> *)local_48.ptr != (internal_node<char,_false> *)0x0) {
              ((internal_node<char,_false> *)local_48.ptr)->_ref_count =
                   ((internal_node<char,_false> *)local_48.ptr)->_ref_count + 1;
            }
            bVar4 = validate_subtree<char,false,5>
                              (&local_48,local_38 - (uVar7 << (bVar8 & 0x1f)),local_3c);
            ref<immutable::rrb_details::tree_node<char,_false>_>::~ref(&local_48);
            if (bVar4) goto LAB_001490cc;
LAB_001490d1:
            bVar4 = false;
            goto LAB_001490d4;
          }
          pcVar10 = 
          "Expected size (%u) is smaller than %u, implying that some non-rightmost node\n is not completely populated.\n"
          ;
        }
LAB_00149007:
        bVar4 = false;
        printf(pcVar10,uVar11,(ulong)uVar6);
      }
      else {
        uVar6 = prVar2->size[p_node->len - 1];
        if (uVar6 != expected_size) {
          pcVar10 = "Expected subtree to be of size %u, but its size table says it is %u.\n";
          goto LAB_00149007;
        }
        if (p_node->len != 0) {
          uVar11 = 0;
          do {
            prVar2 = (p_node->size_table).ptr;
            if (prVar2 == (rrb_size_table<false> *)0x0) {
              pcVar10 = 
              "T *immutable::ref<immutable::rrb_details::rrb_size_table<false>>::operator->() const [T = immutable::rrb_details::rrb_size_table<false>]"
              ;
              goto LAB_00149122;
            }
            puVar3 = prVar2->size;
            if (uVar11 == 0) {
              uVar6 = 0;
            }
            else {
              uVar6 = puVar3[uVar11 - 1];
            }
            uVar1 = puVar3[uVar11];
            local_48.ptr = (tree_node<char,_false> *)p_node->child[uVar11].ptr;
            if ((internal_node<char,_false> *)local_48.ptr != (internal_node<char,_false> *)0x0) {
              ((internal_node<char,_false> *)local_48.ptr)->_ref_count =
                   ((internal_node<char,_false> *)local_48.ptr)->_ref_count + 1;
            }
            bVar4 = validate_subtree<char,false,5>(&local_48,uVar1 - uVar6,root_shift - 5);
            ref<immutable::rrb_details::tree_node<char,_false>_>::~ref(&local_48);
            if (!bVar4) goto LAB_001490d1;
            uVar11 = uVar11 + 1;
          } while (uVar11 < p_node->len);
        }
LAB_001490cc:
        bVar4 = true;
      }
LAB_001490d4:
      release<char>(p_node);
      if (bVar4) goto LAB_001490e5;
    }
    else {
      puts("Expected this node to be an internal node, but it claims to be something else.");
      pcVar10 = "Will treat it like an internal node, so may segfault.";
LAB_00148f6c:
      puts(pcVar10);
    }
LAB_00148fb7:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool validate_subtree(const ref<tree_node<T, atomic_ref_counting>>& root, uint32_t expected_size, uint32_t root_shift)
      {
      if (root_shift == 0)
        { // leaf node
        if (root->type != LEAF_NODE)
          {
          printf("Expected this node to be a leaf node, but it claims to be something else.\n");
          printf("Will treat it like a leaf node, so may segfault.\n");
          return false;
          }
        ref<leaf_node<T, atomic_ref_counting>> leaf = root;
        if (leaf->len != expected_size)
          {
          printf("Leaf node claims to be %u elements long, but was expected to be %u\n elements long. Will attempt to read %u elements.\n",
            leaf->len, expected_size, std::max<uint32_t>(leaf->len, expected_size));
          return false;
          }
        }
      else
        {
        if (root->type != INTERNAL_NODE)
          {
          printf("Expected this node to be an internal node, but it claims to be something else.\n");
          printf("Will treat it like an internal node, so may segfault.\n");
          return false;
          }
        ref<internal_node<T, atomic_ref_counting>> internal = root;
        if (internal->size_table.ptr != nullptr)
          {
          // expected size should be consistent with what's in the last size table
          // slot
          if (internal->size_table->size[internal->len - 1] != expected_size)
            {
            printf("Expected subtree to be of size %u, but its size table says it is %u.\n", expected_size,
              internal->size_table->size[internal->len - 1]);
            return false;
            }
          for (uint32_t i = 0; i < internal->len; i++)
            {
            uint32_t size_sub_trie = internal->size_table->size[i] - (i == 0 ? 0 : internal->size_table->size[i - 1]);
            ref<tree_node<T, atomic_ref_counting>> child = internal->child[i];
            if (!validate_subtree<T, atomic_ref_counting, N>(child, size_sub_trie, root_shift - bits<N>::rrb_bits))
              return false;
            }
          }
        else
          {
          // internal->size_table == NULL
          // this tree may contain at most (internal->len << shift) elements, not
          // more. Effectively, the tree contains (len - 1) << shift + last_tree_len
          // (1 << shift) >= last_tree_len > 0
          const uint32_t child_shift = root_shift - bits<N>::rrb_bits;
          const uint32_t child_max_size = 1 << root_shift;

          if (expected_size > internal->len * child_max_size)
            {
            printf("Expected size (%u) is larger than what can possibly be inside this subtree: %u.\n", expected_size,
              internal->len * child_max_size);
            return false;
            }
          else if (expected_size < ((internal->len - 1) * child_max_size))
            {
            printf("Expected size (%u) is smaller than %u, implying that some non-rightmost node\n is not completely populated.\n",
              expected_size, ((internal->len - 1) << root_shift));
            return false;
            }
          for (uint32_t i = 0; i < internal->len - 1; i++)
            {
            ref<tree_node<T, atomic_ref_counting>> child = internal->child[i];
            if (!validate_subtree<T, atomic_ref_counting, N>(child, child_max_size, child_shift))
              return false;
            }
          ref<tree_node<T, atomic_ref_counting>> child = internal->child[internal->len - 1];
          if (!validate_subtree<T, atomic_ref_counting, N>(child, expected_size - ((internal->len - 1) * child_max_size), child_shift))
            return false;
          }
        }
      return true;
      }